

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_import::dump(statement_import *this,ostream *o)

{
  pointer ppVar1;
  ostream *poVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  *val;
  pointer ppVar3;
  
  ppVar1 = (this->m_var_list).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->m_var_list).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    poVar2 = std::operator<<(o,"< Import: Name = \"");
    poVar2 = std::operator<<(poVar2,(string *)ppVar3);
    std::operator<<(poVar2,"\" >\n");
  }
  return;
}

Assistant:

void statement_import::dump(std::ostream &o) const
	{
		for (auto &val: m_var_list)
			o << "< Import: Name = \"" << val.first << "\" >\n";
	}